

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerPerformance_Test::TestBody
          (Sampler_testProbabilisticSamplerPerformance_Test *this)

{
  bool bVar1;
  result_type rVar2;
  result_type_conflict low;
  ostream *poVar3;
  undefined1 auVar4 [16];
  double rate;
  string local_1458;
  SamplingStatus local_1438;
  undefined1 local_1418 [8];
  TraceID id;
  uint64_t i;
  uint64_t count;
  uniform_int_distribution<unsigned_long> distribution;
  default_random_engine randomGenerator;
  undefined1 local_13d0 [8];
  random_device randomDevice;
  ProbabilisticSampler sampler;
  uint64_t kNumSamples;
  Sampler_testProbabilisticSamplerPerformance_Test *this_local;
  
  ProbabilisticSampler::ProbabilisticSampler
            ((ProbabilisticSampler *)((long)&randomDevice.field_0 + 0x1380),0.001);
  std::random_device::random_device((random_device *)local_13d0);
  rVar2 = std::random_device::operator()((random_device *)local_13d0);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &distribution._M_param._M_b,(ulong)rVar2);
  std::uniform_int_distribution<unsigned_long>::uniform_int_distribution
            ((uniform_int_distribution<unsigned_long> *)&count);
  i = 0;
  for (id._low = 0; id._low < 10000; id._low = id._low + 1) {
    low = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&count,
                     (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                     &distribution._M_param._M_b);
    TraceID::TraceID((TraceID *)local_1418,0,low);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1458,"op",(allocator *)((long)&rate + 7));
    ProbabilisticSampler::isSampled
              (&local_1438,(ProbabilisticSampler *)((long)&randomDevice.field_0 + 0x1380),
               (TraceID *)local_1418,&local_1458);
    bVar1 = SamplingStatus::isSampled(&local_1438);
    SamplingStatus::~SamplingStatus(&local_1438);
    std::__cxx11::string::~string((string *)&local_1458);
    std::allocator<char>::~allocator((allocator<char> *)((long)&rate + 7));
    if (bVar1) {
      i = i + 1;
    }
  }
  auVar4._8_4_ = (int)(i >> 0x20);
  auVar4._0_8_ = i;
  auVar4._12_4_ = 0x45300000;
  poVar3 = std::operator<<((ostream *)&std::cout,"Sampled: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,i);
  poVar3 = std::operator<<(poVar3," rate=");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,((auVar4._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0)) / 10000.0);
  std::operator<<(poVar3,'\n');
  std::random_device::~random_device((random_device *)local_13d0);
  ProbabilisticSampler::~ProbabilisticSampler
            ((ProbabilisticSampler *)((long)&randomDevice.field_0 + 0x1380));
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerPerformance)
{
    constexpr auto kNumSamples = static_cast<uint64_t>(10000);

    ProbabilisticSampler sampler(0.001);
    std::random_device randomDevice;
    std::default_random_engine randomGenerator(randomDevice());
    std::uniform_int_distribution<uint64_t> distribution;
    auto count = static_cast<uint64_t>(0);
    for (auto i = static_cast<uint64_t>(0); i < kNumSamples; ++i) {
        TraceID id(0, distribution(randomGenerator));
        if (sampler.isSampled(id, kTestOperationName).isSampled()) {
            ++count;
        }
    }
    const auto rate = static_cast<double>(count) / kNumSamples;
    std::cout << "Sampled: " << count << " rate=" << rate << '\n';
}